

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::log_message(XmlReporter *this,MessageData *mb)

{
  XmlWriter *this_00;
  XmlWriter *this_01;
  string *text;
  long in_RSI;
  XmlReporter *in_RDI;
  uint *in_stack_00000030;
  string *in_stack_00000038;
  XmlWriter *in_stack_00000040;
  XmlReporter *in_stack_000000c0;
  lock_guard<std::mutex> lock;
  string *in_stack_fffffffffffffe68;
  XmlWriter *in_stack_fffffffffffffe70;
  allocator *paVar1;
  char *in_stack_fffffffffffffe78;
  XmlWriter *this_02;
  allocator local_119;
  string local_118 [8];
  char *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  XmlWriter *in_stack_ffffffffffffff00;
  allocator local_f1;
  string local_f0 [40];
  uint local_c8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe70,
             (mutex_type *)in_stack_fffffffffffffe68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Message",&local_39);
  XmlWriter::startElement(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"type",&local_71);
  failureString(*(Enum *)(local_10 + 0x24));
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"filename",&local_99);
  this_00 = (XmlWriter *)skipPathFromFilename(in_stack_fffffffffffffe78);
  this_01 = XmlWriter::writeAttribute
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0
                      );
  paVar1 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"line",paVar1);
  local_c8 = line(in_RDI,*(uint *)(local_10 + 0x20));
  XmlWriter::writeAttribute<unsigned_int>(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_02 = &in_RDI->xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Text",&local_f1);
  XmlWriter::scopedElement(this_01,(string *)paVar1);
  text = (string *)String::c_str((String *)0x144f06);
  paVar1 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,(char *)text,paVar1);
  XmlWriter::ScopedElement::writeText((ScopedElement *)this_02,text,SUB81((ulong)paVar1 >> 0x38,0));
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)paVar1);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  log_contexts(in_stack_000000c0);
  XmlWriter::endElement(this_00);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x144fb8);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Message")
                    .writeAttribute("type", failureString(mb.m_severity))
                    .writeAttribute("filename", skipPathFromFilename(mb.m_file))
                    .writeAttribute("line", line(mb.m_line));

            xml.scopedElement("Text").writeText(mb.m_string.c_str());

            log_contexts();

            xml.endElement();
        }